

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_sound_srcs.cxx
# Opt level: O0

void __thiscall level_tools::reconstruct_sound_srcs(level_tools *this)

{
  float fVar1;
  bool bVar2;
  xr_level_snd_static *pxVar3;
  sound_src_data_vec *this_00;
  xr_scene_objects *this_01;
  xr_custom_object_vec *this_02;
  size_type __n;
  reference ppsVar4;
  xr_sound_src_object *pxVar5;
  char *pcVar6;
  string *psVar7;
  fvector3 *pfVar8;
  float *pfVar9;
  fvector2 *pfVar10;
  xr_sound_src_object *local_68 [3];
  xr_sound_src_object *local_50;
  xr_sound_src_object *new_sound_src;
  sound_src_data *sound_src;
  sound_src_data_vec_cit end;
  sound_src_data_vec_cit it;
  xr_name_gen name;
  xr_custom_object_vec *cobjects;
  sound_src_data_vec *sound_srcs;
  level_tools *this_local;
  
  pxVar3 = xray_re::xr_level::snd_static(this->m_level);
  if (pxVar3 != (xr_level_snd_static *)0x0) {
    xray_re::msg("building %s","sound_src.part");
    pxVar3 = xray_re::xr_level::snd_static(this->m_level);
    this_00 = xray_re::xr_level_snd_static::sound_srcs(pxVar3);
    this_01 = &xray_re::xr_scene::sound_srcs(this->m_scene)->super_xr_scene_objects;
    this_02 = xray_re::xr_scene_objects::objects(this_01);
    __n = std::vector<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_>::size
                    (this_00);
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_02,__n);
    xray_re::xr_name_gen::xr_name_gen((xr_name_gen *)&it,"sound_src",true);
    end._M_current =
         (sound_src_data **)
         std::vector<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_>::begin
                   (this_00);
    sound_src = (sound_src_data *)
                std::vector<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_>::
                end(this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<xray_re::sound_src_data_*const_*,_std::vector<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_>_>
                                    *)&sound_src), bVar2) {
      ppsVar4 = __gnu_cxx::
                __normal_iterator<xray_re::sound_src_data_*const_*,_std::vector<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_>_>
                ::operator*(&end);
      new_sound_src = (xr_sound_src_object *)*ppsVar4;
      pxVar5 = (xr_sound_src_object *)operator_new(0xd0);
      xray_re::xr_sound_src_object::xr_sound_src_object(pxVar5,this->m_scene);
      local_50 = pxVar5;
      pcVar6 = xray_re::xr_name_gen::get((xr_name_gen *)&it);
      psVar7 = xray_re::xr_custom_object::co_name_abi_cxx11_(&local_50->super_xr_custom_object);
      std::__cxx11::string::operator=((string *)psVar7,pcVar6);
      pfVar8 = xray_re::xr_custom_object::co_position(&local_50->super_xr_custom_object);
      xray_re::_vector3<float>::set<float>
                (pfVar8,(_vector3<float> *)
                        &(new_sound_src->super_xr_custom_object).m_name._M_string_length);
      pxVar5 = new_sound_src;
      psVar7 = xray_re::xr_sound_src_object::source_name_abi_cxx11_(local_50);
      std::__cxx11::string::operator=((string *)psVar7,(string *)pxVar5);
      pfVar8 = xray_re::xr_sound_src_object::sound_pos(local_50);
      xray_re::_vector3<float>::set<float>
                (pfVar8,(_vector3<float> *)
                        &(new_sound_src->super_xr_custom_object).m_name._M_string_length);
      fVar1 = *(float *)((long)&(new_sound_src->super_xr_custom_object).m_name.field_2 + 4);
      pfVar9 = xray_re::xr_sound_src_object::volume(local_50);
      *pfVar9 = fVar1;
      fVar1 = *(float *)((long)&(new_sound_src->super_xr_custom_object).m_name.field_2 + 8);
      pfVar9 = xray_re::xr_sound_src_object::frequency(local_50);
      *pfVar9 = fVar1;
      pfVar10 = xray_re::xr_sound_src_object::pause_time(local_50);
      xray_re::_vector2<float>::set
                (pfVar10,(float)*(int *)&(new_sound_src->super_xr_custom_object).m_rotation.field_0,
                 (float)*(int *)((long)&(new_sound_src->super_xr_custom_object).m_rotation.field_0 +
                                4));
      pfVar10 = xray_re::xr_sound_src_object::active_time(local_50);
      xray_re::_vector2<float>::set
                (pfVar10,(float)*(int *)((long)&(new_sound_src->super_xr_custom_object).m_name.
                                                field_2 + 0xc),
                 (float)*(int *)&(new_sound_src->super_xr_custom_object).m_position.field_0);
      pfVar10 = xray_re::xr_sound_src_object::play_time(local_50);
      xray_re::_vector2<float>::set
                (pfVar10,(float)*(int *)((long)&(new_sound_src->super_xr_custom_object).m_position.
                                                field_0 + 4),
                 (float)*(int *)((long)&(new_sound_src->super_xr_custom_object).m_position.field_0 +
                                8));
      local_68[0] = local_50;
      std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
      push_back(this_02,(value_type *)local_68);
      __gnu_cxx::
      __normal_iterator<xray_re::sound_src_data_*const_*,_std::vector<xray_re::sound_src_data_*,_std::allocator<xray_re::sound_src_data_*>_>_>
      ::operator++(&end);
      xray_re::xr_name_gen::next((xr_name_gen *)&it);
    }
    xray_re::xr_level::clear_snd_static(this->m_level);
    xray_re::xr_name_gen::~xr_name_gen((xr_name_gen *)&it);
  }
  return;
}

Assistant:

void level_tools::reconstruct_sound_srcs()
{
	if (m_level->snd_static() == 0)
		return;
	msg("building %s", "sound_src.part");

	const sound_src_data_vec& sound_srcs = m_level->snd_static()->sound_srcs();

	xr_custom_object_vec& cobjects = m_scene->sound_srcs()->objects();
	cobjects.reserve(sound_srcs.size());

	xr_name_gen name("sound_src");
	for (sound_src_data_vec_cit it = sound_srcs.begin(), end = sound_srcs.end();
			it != end; ++it, name.next()) {
		const sound_src_data* sound_src = *it;
		xr_sound_src_object* new_sound_src = new xr_sound_src_object(*m_scene);
		new_sound_src->co_name() = name.get();
		new_sound_src->co_position().set(sound_src->position);
//		new_sound_src->flags() = 0;
//		new_sound_src->type() = SOUNDSRC_TYPE_0;
		new_sound_src->source_name() = sound_src->name;
		new_sound_src->sound_pos().set(sound_src->position);
		new_sound_src->volume() = sound_src->volume;
		new_sound_src->frequency() = sound_src->freq;
		new_sound_src->pause_time().set(float(sound_src->pause_time.x),
				float(sound_src->pause_time.y));
		new_sound_src->active_time().set(float(sound_src->active_time.x),
				float(sound_src->active_time.y));
		new_sound_src->play_time().set(float(sound_src->play_time.x),
				float(sound_src->play_time.y));
		cobjects.push_back(new_sound_src);
	}
	m_level->clear_snd_static();
}